

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeMinContributionValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  size_type __n;
  pointer pdVar1;
  ulong uVar2;
  ostream *poVar3;
  uint jtI;
  Index ja;
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  double local_48;
  string local_40;
  undefined1 extraout_var [56];
  
  __n = BayesianGameBase::GetNrJointTypes();
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_40);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (jtI = 0; (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != (ulong)jtI;
      jtI = jtI + 1) {
    uVar4 = 0;
    local_48 = 1.79769313486232e+308;
    while( true ) {
      uVar2 = BayesianGameBase::GetNrJointActions();
      if (uVar2 == uVar4) break;
      auVar5._0_8_ = GetContribution(this,jtI,(Index)uVar4);
      auVar5._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_48;
      uVar4 = (ulong)((Index)uVar4 + 1);
      auVar6 = vminsd_avx(auVar6,auVar5._0_16_);
      local_48 = auVar6._0_8_;
    }
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[jtI] = local_48;
  }
  if (2 < this->_m_verbosity) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Minimum contribution values: ");
    PrintTools::SoftPrintVector<double>(&local_40,__return_storage_ptr__);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ComputeMinContributionValues() const
    {
        std::vector<double> minValues(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=minValues.size();++i)
        {
            double minValue=DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                minValue=std::min(c,minValue);
            }
            minValues[i]=minValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Minimum contribution values: "
                      << SoftPrintVector(minValues)
                      << std::endl;
        return(minValues);
    }